

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  Arena *v1;
  Nonnull<const_char_*> failure_msg;
  LogMessageFatal LStack_18;
  
  v1 = MapFieldBase::arena(&this->super_MapFieldBase);
  if (v1 == (Arena *)0x0) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (v1,(void *)0x0,"arena() == nullptr");
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    if ((this->map_).num_buckets_ != 1) {
      UntypedMapBase::ClearTableImpl(&this->map_,false);
    }
    MapFieldBase::~MapFieldBase(&this->super_MapFieldBase);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
             ,0xa0,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

DynamicMapField::~DynamicMapField() {
  ABSL_DCHECK_EQ(arena(), nullptr);
  map_.ClearTable(false);
}